

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,REF_GRID ref_grid)

{
  REF_INT node_00;
  REF_INT reference;
  REF_NODE ref_node_00;
  uint uVar1;
  REF_MIGRATE pRVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  REF_INT *pRVar5;
  REF_GLOB local_80;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT n1;
  REF_INT n0;
  REF_INT cell_edge;
  REF_INT cell;
  REF_INT group;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MIGRATE ref_migrate;
  REF_GRID ref_grid_local;
  REF_MIGRATE *ref_migrate_ptr_local;
  
  ref_node_00 = ref_grid->node;
  pRVar2 = (REF_MIGRATE)malloc(0x48);
  *ref_migrate_ptr = pRVar2;
  if (*ref_migrate_ptr == (REF_MIGRATE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x43,
           "ref_migrate_create","malloc *ref_migrate_ptr of REF_MIGRATE_STRUCT NULL");
    ref_migrate_ptr_local._4_4_ = 2;
  }
  else {
    pRVar2 = *ref_migrate_ptr;
    pRVar2->grid = ref_grid;
    ref_migrate_ptr_local._4_4_ = ref_adj_create(&pRVar2->parent_local);
    if (ref_migrate_ptr_local._4_4_ == 0) {
      ref_migrate_ptr_local._4_4_ = ref_adj_create(&pRVar2->parent_part);
      if (ref_migrate_ptr_local._4_4_ == 0) {
        ref_migrate_ptr_local._4_4_ = ref_adj_create(&pRVar2->conn);
        if (ref_migrate_ptr_local._4_4_ == 0) {
          pRVar2->max = ref_node_00->max;
          if (pRVar2->max < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x50,"ref_migrate_create","malloc ref_migrate->global of REF_GLOB negative");
            ref_migrate_ptr_local._4_4_ = 1;
          }
          else {
            pRVar3 = (REF_GLOB *)malloc((long)pRVar2->max << 3);
            pRVar2->global = pRVar3;
            if (pRVar2->global == (REF_GLOB *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x50,"ref_migrate_create","malloc ref_migrate->global of REF_GLOB NULL");
              ref_migrate_ptr_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_4 = 0; ref_private_macro_code_rss_4 < pRVar2->max;
                  ref_private_macro_code_rss_4 = ref_private_macro_code_rss_4 + 1) {
                pRVar2->global[ref_private_macro_code_rss_4] = -1;
              }
              if (pRVar2->max * 3 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x51,"ref_migrate_create","malloc ref_migrate->xyz of REF_DBL negative");
                ref_migrate_ptr_local._4_4_ = 1;
              }
              else {
                pRVar4 = (REF_DBL *)malloc((long)(pRVar2->max * 3) << 3);
                pRVar2->xyz = pRVar4;
                if (pRVar2->xyz == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x51,"ref_migrate_create","malloc ref_migrate->xyz of REF_DBL NULL");
                  ref_migrate_ptr_local._4_4_ = 2;
                }
                else if (pRVar2->max < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x52,"ref_migrate_create","malloc ref_migrate->weight of REF_DBL negative"
                        );
                  ref_migrate_ptr_local._4_4_ = 1;
                }
                else {
                  pRVar4 = (REF_DBL *)malloc((long)pRVar2->max << 3);
                  pRVar2->weight = pRVar4;
                  if (pRVar2->weight == (REF_DBL *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x52,"ref_migrate_create","malloc ref_migrate->weight of REF_DBL NULL");
                    ref_migrate_ptr_local._4_4_ = 2;
                  }
                  else if (pRVar2->max < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x53,"ref_migrate_create","malloc ref_migrate->age of REF_INT negative")
                    ;
                    ref_migrate_ptr_local._4_4_ = 1;
                  }
                  else {
                    pRVar5 = (REF_INT *)malloc((long)pRVar2->max << 2);
                    pRVar2->age = pRVar5;
                    if (pRVar2->age == (REF_INT *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x53,"ref_migrate_create","malloc ref_migrate->age of REF_INT NULL");
                      ref_migrate_ptr_local._4_4_ = 2;
                    }
                    else {
                      for (cell = 0; cell < ref_node_00->max; cell = cell + 1) {
                        if ((((-1 < cell) && (cell < ref_node_00->max)) &&
                            (-1 < ref_node_00->global[cell])) &&
                           (ref_node_00->ref_mpi->id == ref_node_00->part[cell])) {
                          if (((cell < 0) || (ref_node_00->max <= cell)) ||
                             (ref_node_00->global[cell] < 0)) {
                            local_80 = -1;
                          }
                          else {
                            local_80 = ref_node_00->global[cell];
                          }
                          pRVar2->global[cell] = local_80;
                          uVar1 = ref_adj_add(pRVar2->parent_local,cell,cell);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x59,"ref_migrate_create",(ulong)uVar1,"add");
                            return uVar1;
                          }
                          uVar1 = ref_adj_add(pRVar2->parent_part,cell,ref_node_00->part[cell]);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x5c,"ref_migrate_create",(ulong)uVar1,"add");
                            return uVar1;
                          }
                          pRVar2->xyz[cell * 3] = ref_node_00->real[cell * 0xf];
                          pRVar2->xyz[cell * 3 + 1] = ref_node_00->real[cell * 0xf + 1];
                          pRVar2->xyz[cell * 3 + 2] = ref_node_00->real[cell * 0xf + 2];
                          pRVar2->weight[cell] = 1.0;
                          pRVar2->age[cell] = ref_node_00->age[cell];
                        }
                      }
                      ref_migrate_ptr_local._4_4_ = ref_node_ghost_int(ref_node_00,pRVar2->age,1);
                      if (ref_migrate_ptr_local._4_4_ == 0) {
                        cell_edge = 3;
                        _group = ref_grid->cell[3];
                        while (cell_edge < 0x10) {
                          for (n0 = 0; n0 < _group->max; n0 = n0 + 1) {
                            if (((-1 < n0) && (n0 < _group->max)) &&
                               (_group->c2n[_group->size_per * n0] != -1)) {
                              for (n1 = 0; n1 < _group->edge_per; n1 = n1 + 1) {
                                node_00 = _group->c2n[_group->e2n[n1 << 1] + _group->size_per * n0];
                                reference = _group->c2n
                                            [_group->e2n[n1 * 2 + 1] + _group->size_per * n0];
                                uVar1 = ref_adj_add_uniquely(pRVar2->conn,node_00,reference);
                                if (uVar1 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                         ,0x6f,"ref_migrate_create",(ulong)uVar1,"uniq");
                                  return uVar1;
                                }
                                uVar1 = ref_adj_add_uniquely(pRVar2->conn,reference,node_00);
                                if (uVar1 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                         ,0x71,"ref_migrate_create",(ulong)uVar1,"uniq");
                                  return uVar1;
                                }
                              }
                            }
                          }
                          cell_edge = cell_edge + 1;
                          _group = ref_grid->cell[cell_edge];
                        }
                        ref_migrate_ptr_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x65,"ref_migrate_create",(ulong)ref_migrate_ptr_local._4_4_,
                               "ghost age for edge weights");
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x4b,"ref_migrate_create",(ulong)ref_migrate_ptr_local._4_4_,"make adj");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x4a,"ref_migrate_create",(ulong)ref_migrate_ptr_local._4_4_,"make adj");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x49,"ref_migrate_create",(ulong)ref_migrate_ptr_local._4_4_,"make adj");
    }
  }
  return ref_migrate_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,
                                      REF_GRID ref_grid) {
  REF_MIGRATE ref_migrate;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT group, cell, cell_edge, n0, n1;

  ref_malloc(*ref_migrate_ptr, 1, REF_MIGRATE_STRUCT);

  ref_migrate = *ref_migrate_ptr;

  ref_migrate_grid(ref_migrate) = ref_grid;

  RSS(ref_adj_create(&(ref_migrate_parent_local(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_parent_part(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_conn(ref_migrate))), "make adj");

  ref_migrate_max(ref_migrate) = ref_node_max(ref_node);

  ref_malloc_init(ref_migrate->global, ref_migrate_max(ref_migrate), REF_GLOB,
                  REF_EMPTY);
  ref_malloc(ref_migrate->xyz, 3 * ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->weight, ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->age, ref_migrate_max(ref_migrate), REF_INT);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      ref_migrate_global(ref_migrate, node) = ref_node_global(ref_node, node);
      RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), node, node),
          "add");
      RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), node,
                      ref_node_part(ref_node, node)),
          "add");
      ref_migrate_xyz(ref_migrate, 0, node) = ref_node_xyz(ref_node, 0, node);
      ref_migrate_xyz(ref_migrate, 1, node) = ref_node_xyz(ref_node, 1, node);
      ref_migrate_xyz(ref_migrate, 2, node) = ref_node_xyz(ref_node, 2, node);
      ref_migrate_weight(ref_migrate, node) = 1.0;
      ref_migrate_age(ref_migrate, node) = ref_node_age(ref_node, node);
    }
  }
  RSS(ref_node_ghost_int(ref_node, (ref_migrate->age), 1),
      "ghost age for edge weights");

  /* 2d included for twod */
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        /* need ghost nodes for agglomeration */
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n0, n1),
            "uniq");
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n1, n0),
            "uniq");
      }
    }
  }

  return REF_SUCCESS;
}